

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_internal.h
# Opt level: O0

void http_s_destroy(http_s *h,uint8_t log)

{
  http_s *__dest;
  void *local_98;
  uintptr_t local_90;
  uint8_t local_11;
  http_s *phStack_10;
  uint8_t log_local;
  http_s *h_local;
  
  local_11 = log;
  phStack_10 = h;
  if (((log != '\0') && (h->status != 0)) && (h->status_str == 0)) {
    http_write_log(h);
  }
  fiobj_free(phStack_10->method);
  fiobj_free(phStack_10->status_str);
  fiobj_free((phStack_10->private_data).out_headers);
  fiobj_free(phStack_10->headers);
  fiobj_free(phStack_10->version);
  fiobj_free(phStack_10->query);
  fiobj_free(phStack_10->path);
  fiobj_free(phStack_10->cookies);
  fiobj_free(phStack_10->body);
  fiobj_free(phStack_10->params);
  __dest = phStack_10;
  memset(&local_98,0,0x80);
  local_98 = (phStack_10->private_data).vtbl;
  local_90 = (phStack_10->private_data).flag;
  memcpy(__dest,&local_98,0x80);
  return;
}

Assistant:

static inline void http_s_destroy(http_s *h, uint8_t log) {
  if (log && h->status && !h->status_str) {
    http_write_log(h);
  }
  fiobj_free(h->method);
  fiobj_free(h->status_str);
  fiobj_free(h->private_data.out_headers);
  fiobj_free(h->headers);
  fiobj_free(h->version);
  fiobj_free(h->query);
  fiobj_free(h->path);
  fiobj_free(h->cookies);
  fiobj_free(h->body);
  fiobj_free(h->params);

  *h = (http_s){
      .private_data.vtbl = h->private_data.vtbl,
      .private_data.flag = h->private_data.flag,
  };
}